

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  Arena *pAVar1;
  Rep *pRVar2;
  undefined8 uVar3;
  LogMessage *pLVar4;
  LogFinisher local_69;
  RepeatedPtrFieldBase local_68;
  LogMessage local_50;
  
  local_68.arena_ = other->arena_;
  if (local_68.arena_ == this->arena_) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x342);
    pLVar4 = LogMessage::operator<<(&local_50,"CHECK failed: other->GetArena() != GetArena(): ");
    LogFinisher::operator=((LogFinisher *)&local_68,pLVar4);
    LogMessage::~LogMessage(&local_50);
    local_68.arena_ = other->arena_;
  }
  local_68.current_size_ = 0;
  local_68.total_size_ = 0;
  local_68.rep_ = (Rep *)0x0;
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(&local_68,this);
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(this);
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(this,other);
  if (&local_68 == other) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x6f7);
    pLVar4 = LogMessage::operator<<(&local_50,"CHECK failed: this != rhs: ");
    LogFinisher::operator=(&local_69,pLVar4);
    LogMessage::~LogMessage(&local_50);
  }
  pAVar1 = other->arena_;
  pRVar2 = other->rep_;
  uVar3._0_4_ = other->current_size_;
  uVar3._4_4_ = other->total_size_;
  other->arena_ = local_68.arena_;
  other->current_size_ = local_68.current_size_;
  other->total_size_ = local_68.total_size_;
  other->rep_ = local_68.rep_;
  local_68.arena_ = pAVar1;
  local_68._8_8_ = uVar3;
  local_68.rep_ = pRVar2;
  Destroy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(&local_68);
  ~RepeatedPtrFieldBase(&local_68);
  return;
}

Assistant:

void RepeatedPtrFieldBase::SwapFallback(RepeatedPtrFieldBase* other) {
#ifdef PROTOBUF_FORCE_COPY_IN_SWAP
  GOOGLE_DCHECK(GetArena() == nullptr || other->GetArena() != GetArena());
#else   // PROTOBUF_FORCE_COPY_IN_SWAP
  GOOGLE_DCHECK(other->GetArena() != GetArena());
#endif  // !PROTOBUF_FORCE_COPY_IN_SWAP

  // Copy semantics in this case. We try to improve efficiency by placing the
  // temporary on |other|'s arena so that messages are copied twice rather than
  // three times.
  RepeatedPtrFieldBase temp(other->GetArena());
  temp.MergeFrom<TypeHandler>(*this);
  this->Clear<TypeHandler>();
  this->MergeFrom<TypeHandler>(*other);
  other->InternalSwap(&temp);
  temp.Destroy<TypeHandler>();  // Frees rep_ if `other` had no arena.
}